

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_peer.cpp
# Opt level: O2

bool __thiscall udpdiscovery::Peer::Start(Peer *this,PeerParameters *parameters,string *user_data)

{
  bool bVar1;
  PeerEnv *this_00;
  MinimalisticThread *pMVar2;
  
  Stop(this,false);
  this_00 = (PeerEnv *)operator_new(0xb8);
  impl::PeerEnv::PeerEnv(this_00);
  bVar1 = impl::PeerEnv::Start(this_00,parameters,user_data);
  if (bVar1) {
    this->env_ = (PeerEnvInterface *)this_00;
    pMVar2 = (MinimalisticThread *)operator_new(0x18);
    impl::MinimalisticThread::MinimalisticThread(pMVar2,impl::SendingThreadFunc,this_00);
    this->sending_thread_ = (MinimalisticThreadInterface *)pMVar2;
    if (parameters->can_discover_ == true) {
      pMVar2 = (MinimalisticThread *)operator_new(0x18);
      impl::MinimalisticThread::MinimalisticThread(pMVar2,impl::ReceivingThreadFunc,this->env_);
      this->receiving_thread_ = (MinimalisticThreadInterface *)pMVar2;
    }
  }
  else {
    (*(this_00->super_PeerEnvInterface)._vptr_PeerEnvInterface[1])(this_00);
  }
  return bVar1;
}

Assistant:

bool Peer::Start(const PeerParameters& parameters,
                 const std::string& user_data) {
  Stop(false);

  impl::PeerEnv* env = new impl::PeerEnv();
  if (!env->Start(parameters, user_data)) {
    delete env;
    env = 0;

    return false;
  }

  env_ = env;

  sending_thread_ = new impl::MinimalisticThread(impl::SendingThreadFunc, env_);

  if (parameters.can_discover()) {
    receiving_thread_ =
        new impl::MinimalisticThread(impl::ReceivingThreadFunc, env_);
  }

  return true;
}